

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

TSampleF filterSecondOrderButterworthHighPass(TFilterCoefficients *coefficients,TSampleF sample)

{
  TSampleF xn;
  float fVar1;
  
  fVar1 = ((coefficients->a2 * coefficients->xnz2 +
           coefficients->a0 * sample + coefficients->a1 * coefficients->xnz1) -
          coefficients->b1 * coefficients->ynz1) - coefficients->b2 * coefficients->ynz2;
  coefficients->xnz2 = coefficients->xnz1;
  coefficients->xnz1 = sample;
  coefficients->ynz2 = coefficients->ynz1;
  coefficients->ynz1 = fVar1;
  return fVar1;
}

Assistant:

TSampleF filterSecondOrderButterworthHighPass(TFilterCoefficients & coefficients, TSampleF sample) {
    TSampleF xn = sample;
    TSampleF yn =
        coefficients.a0*xn + coefficients.a1*coefficients.xnz1 + coefficients.a2*coefficients.xnz2 -
                             coefficients.b1*coefficients.ynz1 - coefficients.b2*coefficients.ynz2;

    coefficients.xnz2 = coefficients.xnz1;
    coefficients.xnz1 = xn;
    coefficients.ynz2 = coefficients.ynz1;
    coefficients.ynz1 = yn;

    return yn;
}